

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  undefined8 unaff_RBP;
  ExceptionOr<bool> result;
  ExceptionOrValue local_178;
  char local_18;
  undefined1 local_17;
  
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)this,&local_178,(WaitScope *)__stat_loc);
  if (local_18 == '\x01') {
    exception = &local_178.exception.ptr.field_1;
    if (local_178.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    if (local_178.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),local_17);
  }
  if (local_178.exception.ptr.isSet != false) {
    throwFatalException(&local_178.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }